

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void logical_or_vec(int n,int *vals,int *auxs,int *accum,int *accum_aux)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  *accum = 0x7ffffffe;
  if (n < 1) {
    *accum_aux = 0x7ffffffe;
    return;
  }
  uVar3 = 0x7ffffffe;
  uVar2 = 0;
  do {
    uVar1 = vals[uVar2];
    if (uVar1 != 0x7ffffffe) {
      if (uVar1 == 0x7fffffff) {
        uVar1 = 0x7fffffff;
        if (uVar3 != 0x7ffffffe) goto LAB_001c46ff;
      }
      else {
        if (uVar3 < 0x7ffffffe) {
          uVar1 = uVar3 | uVar1;
        }
        uVar1 = (uint)(uVar1 != 0);
      }
      uVar3 = uVar1;
      *accum = uVar3;
    }
LAB_001c46ff:
    uVar2 = uVar2 + 1;
  } while ((uint)n != uVar2);
  *accum_aux = 0x7ffffffe;
  if (0 < n) {
    uVar3 = 0x7ffffffe;
    uVar2 = 0;
    do {
      uVar1 = auxs[uVar2];
      if (uVar1 != 0x7ffffffe) {
        if (uVar1 == 0x7fffffff) {
          uVar1 = 0x7fffffff;
          if (uVar3 != 0x7ffffffe) goto LAB_001c475a;
        }
        else {
          if (uVar3 < 0x7ffffffe) {
            uVar1 = uVar3 | uVar1;
          }
          uVar1 = (uint)(uVar1 != 0);
        }
        uVar3 = uVar1;
        *accum_aux = uVar3;
      }
LAB_001c475a:
      uVar2 = uVar2 + 1;
    } while ((uint)n != uVar2);
  }
  return;
}

Assistant:

static void logical_or_vec(int n, const int *vals, const int *auxs,
	int *accum, int *accum_aux)
{
	int i;

	*accum = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(vals[i], accum);
	}

	*accum_aux = UI_ENTRY_VALUE_NOT_PRESENT;
	for (i = 0; i < n; ++i) {
		logical_or_combine_accum_help(auxs[i], accum_aux);
	}
}